

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O3

bool __thiscall IntElemBoundsImp<0,_0,_0>::propagate(IntElemBoundsImp<0,_0,_0> *this)

{
  byte bVar1;
  IntView<0> *pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  Clause *pCVar8;
  IntVar *pIVar9;
  anon_union_8_2_743a5d44_for_Reason_0 aVar10;
  ulong uVar11;
  Lit p;
  IntView<0> *pIVar12;
  IntVar *pIVar13;
  ulong uVar14;
  anon_union_8_2_743a5d44_for_Reason_0 aVar15;
  bool bVar16;
  anon_union_8_2_743a5d44_for_Reason_0 aVar17;
  int64_t m_v;
  ulong uVar18;
  initializer_list<Lit> __l;
  initializer_list<Lit> __l_00;
  initializer_list<Lit> __l_01;
  initializer_list<Lit> __l_02;
  initializer_list<Lit> __l_03;
  initializer_list<Lit> __l_04;
  initializer_list<Lit> __l_05;
  initializer_list<Lit> __l_06;
  Clause *c;
  vector<Lit,_std::allocator<Lit>_> expl;
  allocator_type local_131;
  anon_union_8_2_743a5d44_for_Reason_0 local_130;
  vector<Lit,_std::allocator<Lit>_> local_128;
  vector<Lit,_std::allocator<Lit>_> local_108;
  vector<Lit,_std::allocator<Lit>_> local_f0;
  vector<Lit,_std::allocator<Lit>_> local_d8;
  vector<Lit,_std::allocator<Lit>_> local_c0;
  vector<Lit,_std::allocator<Lit>_> local_a8;
  vector<Lit,_std::allocator<Lit>_> local_90;
  vector<Lit,_std::allocator<Lit>_> local_78;
  vector<Lit,_std::allocator<Lit>_> local_60;
  vector<Lit,_std::allocator<Lit>_> local_48;
  
  uVar5 = (this->b).v;
  bVar1 = sat.assigns.data[uVar5];
  if ((char)bVar1 == 0) {
    if ((this->is_fixed).v == '\0') {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (Lit *)0x0;
      aVar10._pt = (Clause *)0x0;
      bVar16 = false;
      uVar5 = 0;
      do {
        uVar18 = (ulong)uVar5;
        pIVar9 = (this->x).var;
        lVar7 = (long)(pIVar9->max).v;
        if ((lVar7 < (long)uVar18 || (long)uVar18 < (long)(pIVar9->min).v) ||
           ((pIVar9->vals != (Tchar *)0x0 && (pIVar9->vals[uVar18].v == '\0')))) {
          iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xd])(pIVar9,uVar18,1);
          local_130._a._0_4_ = iVar4;
          if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                      (&local_128,
                       (iterator)
                       local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_finish,(Lit *)&local_130);
          }
          else {
            (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data
            ._M_finish)->x = iVar4;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          pIVar9 = (this->y).var;
          pIVar13 = (this->a).data[uVar18].var;
          if ((pIVar9->max).v < (pIVar13->min).v) {
            if (!bVar16) {
              iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[9])(pIVar9);
              local_130._a._0_4_ = iVar4;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar4;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              pIVar13 = (this->a).data[uVar18].var;
            }
            iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[8])();
            local_130._a._0_4_ = iVar4;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                        (&local_128,
                         (iterator)
                         local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Lit *)&local_130);
            }
            else {
              (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = iVar4;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            bVar16 = true;
          }
          else {
            if ((pIVar9->min).v <= (pIVar13->max).v) goto LAB_001a2a28;
            if (aVar10._pt == (Clause *)0x0) {
              iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[8])(pIVar9);
              local_130._a._0_4_ = iVar4;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar4;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              pIVar13 = (this->a).data[uVar18].var;
            }
            iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[9])();
            local_130._a._0_4_ = iVar4;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                        (&local_128,
                         (iterator)
                         local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Lit *)&local_130);
            }
            else {
              (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = iVar4;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            aVar10._a = 1;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 <= (this->a).sz);
      lVar7 = (long)(((this->x).var)->max).v;
      uVar18 = (ulong)uVar5;
LAB_001a2a28:
      if (lVar7 < (long)uVar18) {
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_108,&local_128);
        iVar4 = (int)((ulong)((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
        *(uint *)local_130._pt = iVar4 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        aVar10 = local_130;
        if ((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          if (local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a31b2;
        }
        else {
          lVar6 = (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          uVar5 = *(uint *)local_130._pt;
          uVar11 = 0;
          do {
            if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar11) goto LAB_001a38ae;
            *(int *)(local_130._a + 8 + uVar11 * 4) =
                 local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].x;
            uVar11 = uVar11 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != uVar11);
LAB_001a31b2:
          operator_delete(local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)aVar10);
        aVar10._a._1_7_ = 0;
        aVar10._a._0_1_ = sat.confl == (Clause *)0x0;
      }
      if ((IntElemBoundsImp<0,_0,_0> *)
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start != (IntElemBoundsImp<0,_0,_0> *)0x0) {
        operator_delete(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (lVar7 < (long)uVar18) goto LAB_001a388f;
      goto LAB_001a31fa;
    }
LAB_001a2af7:
    iVar4 = (this->fixed_index).v;
    lVar7 = (long)iVar4;
    if ((-1 < lVar7) && (iVar4 < (int)(this->a).sz)) {
      pIVar2 = (this->a).data;
      pIVar12 = pIVar2 + lVar7;
      pIVar9 = pIVar2[lVar7].var;
      iVar4 = (pIVar9->min).v;
      if (bVar1 != 0) {
        pIVar13 = (this->y).var;
        iVar3 = (pIVar13->min).v;
        if (iVar4 <= iVar3) {
LAB_001a32d9:
          if (iVar4 < iVar3) {
            if (so.lazy == true) {
              uVar5 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                     uVar5 * 2);
              iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[8])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar4);
              __l_04._M_len = 3;
              __l_04._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector(&local_60,__l_04,&local_131);
              iVar4 = (int)((ulong)((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
              local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
              *(uint *)local_130._pt = iVar4 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
              aVar10 = local_130;
              if ((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start == 0) {
                if (local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a33fa;
              }
              else {
                lVar7 = (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2;
                uVar5 = *(uint *)local_130._pt;
                uVar18 = 0;
                do {
                  if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar18) goto LAB_001a38ae;
                  ((Clause *)(local_130._a + 8))->data[uVar18 - 1].x =
                       local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar18].x;
                  uVar18 = uVar18 + 1;
                } while (lVar7 + (ulong)(lVar7 == 0) != uVar18);
LAB_001a33fa:
                operator_delete(local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar9 = pIVar12->var;
            }
            else {
              aVar10._pt = (Clause *)0x0;
            }
            iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])
                              (pIVar9,(long)iVar3,aVar10._pt,1);
            if ((char)iVar4 == '\0') goto LAB_001a3832;
            pIVar9 = pIVar12->var;
            pIVar13 = (this->y).var;
          }
          iVar4 = (pIVar9->max).v;
          iVar3 = (pIVar13->max).v;
          if (iVar4 < iVar3) {
            if (so.lazy == true) {
              uVar5 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                     uVar5 * 2);
              iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[9])(pIVar9);
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar3,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar3);
              __l_05._M_len = 3;
              __l_05._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector
                        (&local_78,__l_05,(allocator_type *)&local_130);
              pCVar8 = Reason_new(&local_78);
              if (local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar13 = (this->y).var;
            }
            else {
              pCVar8 = (Clause *)0x0;
            }
            iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xf])
                              (pIVar13,(long)iVar4,pCVar8,1);
            if ((char)iVar4 == '\0') goto LAB_001a3832;
            pIVar13 = (this->y).var;
            iVar3 = (pIVar13->max).v;
            pIVar9 = pIVar12->var;
            iVar4 = (pIVar9->max).v;
          }
          if (iVar3 < iVar4) {
            if (so.lazy == true) {
              uVar5 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                     uVar5 * 2);
              iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[9])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar4);
              __l_06._M_len = 3;
              __l_06._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector
                        (&local_90,__l_06,(allocator_type *)&local_130);
              pCVar8 = Reason_new(&local_90);
              if (local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar9 = pIVar12->var;
            }
            else {
              pCVar8 = (Clause *)0x0;
            }
            iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])
                              (pIVar9,(long)iVar3,pCVar8,1);
            if ((char)iVar4 == '\0') goto LAB_001a3832;
            pIVar13 = (this->y).var;
            iVar3 = (pIVar13->max).v;
          }
          aVar10._a = 1;
          if (((pIVar13->min).v == iVar3) && ((pIVar12->var->min).v == (pIVar12->var->max).v)) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)&(this->super_Propagator).satisfied;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
            vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
            (this->super_Propagator).satisfied.v = '\x01';
          }
          goto LAB_001a388f;
        }
        if (so.lazy) {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)(bVar1 < 0xfe) + uVar5 * 2);
          iVar3 = (*(pIVar12->var->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar3,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
          iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar3);
          __l._M_len = 3;
          __l._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_48,__l,&local_131);
          iVar3 = (int)((ulong)((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_finish -
                               (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar3 * 4 + 8);
          *(uint *)local_130._pt = iVar3 * 0x100 | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          aVar10 = local_130;
          if ((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start == 0) {
            if (local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a32a7;
          }
          else {
            lVar7 = (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2;
            uVar5 = *(uint *)local_130._pt;
            uVar18 = 0;
            do {
              if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar18) goto LAB_001a38ae;
              ((Clause *)(local_130._a + 8))->data[uVar18 - 1].x =
                   local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18].x;
              uVar18 = uVar18 + 1;
            } while (lVar7 + (ulong)(lVar7 == 0) != uVar18);
LAB_001a32a7:
            operator_delete(local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          pIVar13 = (this->y).var;
        }
        else {
          aVar10._pt = (Clause *)0x0;
        }
        iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar13,(long)iVar4,aVar10._pt,1);
        if ((char)iVar4 != '\0') {
          pIVar13 = (this->y).var;
          iVar3 = (pIVar13->min).v;
          pIVar9 = pIVar12->var;
          iVar4 = (pIVar9->min).v;
          goto LAB_001a32d9;
        }
LAB_001a3832:
        aVar10._pt = (Clause *)0x0;
        goto LAB_001a388f;
      }
      pIVar13 = (this->y).var;
      if ((pIVar13->max).v < iVar4) {
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,iVar4);
        iVar4 = (*(pIVar12->var->super_Var).super_Branching._vptr_Branching[8])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
        iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
        __l_02._M_len = 3;
        __l_02._M_array = (iterator)&local_128;
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_a8,__l_02,&local_131);
        iVar4 = (int)((ulong)((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
        *(uint *)local_130._pt = iVar4 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        if ((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar7 = (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          uVar5 = *(uint *)local_130._pt;
          uVar18 = 0;
          do {
            if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar18) goto LAB_001a38ae;
            ((Clause *)(local_130._a + 8))->data[uVar18 - 1].x =
                 local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18].x;
            uVar18 = uVar18 + 1;
          } while (lVar7 + (ulong)(lVar7 == 0) != uVar18);
          goto LAB_001a3298;
        }
LAB_001a328f:
        aVar10 = local_130;
        if (local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish != (pointer)0x0) goto LAB_001a3298;
      }
      else {
        aVar10._a = 1;
        if ((pIVar13->min).v <= (pIVar9->max).v) goto LAB_001a388f;
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,iVar4);
        iVar4 = (*(pIVar12->var->super_Var).super_Branching._vptr_Branching[9])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
        iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
        __l_03._M_len = 3;
        __l_03._M_array = (iterator)&local_128;
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_c0,__l_03,&local_131);
        iVar4 = (int)((ulong)((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
        *(uint *)local_130._pt = iVar4 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) goto LAB_001a328f;
        lVar7 = (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar5 = *(uint *)local_130._pt;
        uVar18 = 0;
        do {
          if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar18) goto LAB_001a38ae;
          ((Clause *)(local_130._a + 8))->data[uVar18 - 1].x =
               local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18].x;
          uVar18 = uVar18 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != uVar18);
LAB_001a3298:
        aVar10 = local_130;
        operator_delete(local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_001a3864;
    }
    iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
    aVar10._pt = (Clause *)((long)iVar4 * 4 + 2);
    p.x = ((this->b).s ^ 1) + (this->b).v * 2;
  }
  else {
    if ((uint)(this->b).s * 2 + -1 == (int)(char)bVar1) {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&(this->super_Propagator).satisfied;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->super_Propagator).satisfied.v = '\x01';
      aVar10._a = 1;
      goto LAB_001a388f;
    }
    if ((this->is_fixed).v != '\0') goto LAB_001a2af7;
    if ((this->a).sz != 0) {
      uVar18 = 0;
      do {
        pIVar9 = (this->x).var;
        if ((((long)(pIVar9->min).v <= (long)uVar18) && ((long)uVar18 <= (long)(pIVar9->max).v)) &&
           ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[uVar18].v != '\0')))) {
          pIVar12 = (this->a).data;
          if ((((this->y).var)->max).v < ((pIVar12[uVar18].var)->min).v) {
            uVar5 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                         uVar5 * 2);
            iVar4 = (*((pIVar12[uVar18].var)->super_Var).super_Branching._vptr_Branching[8])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar4,local_128.
                                               super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
            iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
            __l_00._M_len = 3;
            __l_00._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector(&local_d8,__l_00,&local_131);
            iVar4 = (int)((ulong)((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
            local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
            *(uint *)local_130._pt = iVar4 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
            aVar15 = local_130;
            if ((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              if (local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a2dcc;
            }
            else {
              lVar7 = (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              uVar5 = *(uint *)local_130._pt;
              uVar11 = 0;
              do {
                if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar11) goto LAB_001a38ae;
                ((Clause *)(local_130._a + 8))->data[uVar11 - 1].x =
                     local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11].x;
                uVar11 = uVar11 + 1;
              } while (lVar7 + (ulong)(lVar7 == 0) != uVar11);
LAB_001a2dcc:
              operator_delete(local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            pIVar9 = (this->x).var;
            if ((((long)(pIVar9->min).v <= (long)uVar18) && ((long)uVar18 <= (long)(pIVar9->max).v))
               && ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[uVar18].v != '\0')))) {
              aVar10._pt = (Clause *)0x0;
              if (so.lazy == false) {
                aVar15._pt = aVar10._pt;
              }
              iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0x11])
                                (pIVar9,uVar18,aVar15._pt,1);
              if ((char)iVar4 == '\0') goto LAB_001a388f;
            }
          }
          pIVar12 = (this->a).data;
          if (((pIVar12[uVar18].var)->max).v < (((this->y).var)->min).v) {
            uVar5 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                         uVar5 * 2);
            iVar4 = (*((pIVar12[uVar18].var)->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar4,local_128.
                                               super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
            iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
            __l_01._M_len = 3;
            __l_01._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector(&local_f0,__l_01,&local_131);
            iVar4 = (int)((ulong)((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
            local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
            *(uint *)local_130._pt = iVar4 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
            aVar15 = local_130;
            if ((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              if (local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a2f38;
            }
            else {
              lVar7 = (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              uVar5 = *(uint *)local_130._pt;
              uVar11 = 0;
              do {
                if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar11) goto LAB_001a38ae;
                ((Clause *)(local_130._a + 8))->data[uVar11 - 1].x =
                     local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11].x;
                uVar11 = uVar11 + 1;
              } while (lVar7 + (ulong)(lVar7 == 0) != uVar11);
LAB_001a2f38:
              operator_delete(local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            pIVar9 = (this->x).var;
            if ((((long)(pIVar9->min).v <= (long)uVar18) && ((long)uVar18 <= (long)(pIVar9->max).v))
               && ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[uVar18].v != '\0')))) {
              aVar10._pt = (Clause *)0x0;
              if (so.lazy == false) {
                aVar15._pt = aVar10._pt;
              }
              iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0x11])
                                (pIVar9,uVar18,aVar15._pt,1);
              if ((char)iVar4 == '\0') goto LAB_001a388f;
            }
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (this->a).sz);
    }
LAB_001a31fa:
    if (this->no_min_support != true) {
LAB_001a36ec:
      aVar10._a = 1;
      if (this->no_max_support != true) goto LAB_001a388f;
      uVar18 = (ulong)(this->a).sz;
      if (uVar18 == 0) {
        iVar4 = -1;
        aVar15._a = 0xffffffff80000000;
      }
      else {
        pIVar9 = (this->x).var;
        pIVar12 = (this->a).data;
        uVar11 = 0xffffffff;
        uVar14 = 0;
        aVar17._a = 0xffffffff80000000;
        do {
          if ((((long)(pIVar9->min).v <= (long)uVar14) && ((long)uVar14 <= (long)(pIVar9->max).v))
             && ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[uVar14].v != '\0')))) {
            iVar4 = (pIVar12->var->max).v;
            aVar15 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar4;
            if ((long)aVar17._pt < (long)aVar15._pt) {
              if ((((this->y).var)->max).v <= iVar4) {
                iVar4 = (int)uVar14;
                break;
              }
              uVar11 = uVar14 & 0xffffffff;
              aVar17 = aVar15;
            }
          }
          aVar15 = aVar17;
          iVar4 = (int)uVar11;
          uVar14 = uVar14 + 1;
          pIVar12 = pIVar12 + 1;
          aVar17 = aVar15;
        } while (uVar18 != uVar14);
      }
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&this->max_support;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(4,(this->max_support).v);
      local_130 = aVar15;
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->max_support).v = iVar4;
      pIVar9 = (this->y).var;
      if ((long)aVar15._pt < (long)(pIVar9->max).v) {
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&local_130;
        if (sat.assigns.data[(uint)(this->b).v] == '\0') {
          if ((long)aVar15._pt < (long)(pIVar9->min).v) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            aVar10._pt = propagate::anon_class_16_2_f8370e7b::operator()
                                   ((anon_class_16_2_f8370e7b *)&local_128);
            uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            goto LAB_001a3857;
          }
        }
        else {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this;
          pCVar8 = propagate::anon_class_16_2_f8370e7b::operator()
                             ((anon_class_16_2_f8370e7b *)&local_128);
          if (*(uint *)pCVar8 < 0x200) goto LAB_001a38ae;
          uVar5 = (this->b).v;
          *(uint *)(pCVar8 + 1) = (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) + uVar5 * 2
          ;
          pIVar9 = (this->y).var;
          iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])
                            (pIVar9,local_130._pt,pCVar8,1);
          if ((char)iVar4 == '\0') goto LAB_001a3832;
        }
      }
      this->no_max_support = false;
      goto LAB_001a388f;
    }
    aVar10._a = 0x7fffffffffffffff;
    local_130._a = 0x7fffffffffffffff;
    uVar18 = (ulong)(this->a).sz;
    if (uVar18 == 0) {
      iVar4 = -1;
    }
    else {
      pIVar9 = (this->x).var;
      pIVar12 = (this->a).data;
      uVar11 = 0xffffffff;
      uVar14 = 0;
      do {
        if ((((long)(pIVar9->min).v <= (long)uVar14) && ((long)uVar14 <= (long)(pIVar9->max).v)) &&
           ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[uVar14].v != '\0')))) {
          iVar4 = (pIVar12->var->min).v;
          aVar15 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar4;
          if ((long)aVar15._pt < (long)aVar10._pt) {
            local_130 = aVar15;
            if (iVar4 <= (((this->y).var)->min).v) {
              iVar4 = (int)uVar14;
              break;
            }
            uVar11 = uVar14 & 0xffffffff;
            aVar10 = aVar15;
          }
        }
        iVar4 = (int)uVar11;
        uVar14 = uVar14 + 1;
        pIVar12 = pIVar12 + 1;
      } while (uVar18 != uVar14);
    }
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&this->min_support;
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(4,(this->min_support).v);
    vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
    (this->min_support).v = iVar4;
    pIVar9 = (this->y).var;
    if ((long)local_130._pt <= (long)(pIVar9->min).v) {
LAB_001a36e8:
      this->no_min_support = false;
      goto LAB_001a36ec;
    }
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&local_130;
    if (sat.assigns.data[(uint)(this->b).v] != '\0') {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)this;
      pCVar8 = propagate::anon_class_16_2_f8370e7b::operator()
                         ((anon_class_16_2_f8370e7b *)&local_128);
      if (*(uint *)pCVar8 < 0x200) goto LAB_001a38ae;
      uVar5 = (this->b).v;
      *(uint *)(pCVar8 + 1) = (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) + uVar5 * 2;
      pIVar9 = (this->y).var;
      iVar4 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar9,local_130._pt,pCVar8,1);
      if ((char)iVar4 == '\0') goto LAB_001a3832;
      goto LAB_001a36e8;
    }
    if ((long)local_130._pt <= (long)(pIVar9->max).v) goto LAB_001a36e8;
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)this;
    aVar10._pt = propagate::anon_class_16_2_f8370e7b::operator()
                           ((anon_class_16_2_f8370e7b *)&local_128);
    uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
LAB_001a3857:
    if (*(uint *)aVar10._pt < 0x200) {
LAB_001a38ae:
      abort();
    }
    *(uint *)(aVar10._a + 8) = uVar5;
LAB_001a3864:
    p.x = ((this->b).s ^ 1) + (this->b).v * 2;
  }
  SAT::cEnqueue(&sat,p,(Reason)aVar10);
  aVar10._a._1_7_ = 0;
  aVar10._a._0_1_ = sat.confl == (Clause *)0x0;
LAB_001a388f:
  return SUB81(aVar10._a,0);
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			satisfied = true;
			return true;
		}

		// x is out of bounds
		if ((is_fixed != 0) && (fixed_index < 0 || fixed_index >= static_cast<int>(a.size()))) {
			return b.setVal(false, x.getValLit());
		}

		// y = a[fixed_index]
		if (is_fixed != 0) {
			assert(x.getVal() == fixed_index);
			const IntView<W>& f = a[fixed_index];
			if (b.isFixed()) {
				setDom(y, setMin, f.getMin(), Reason_new({b.getValLit(), f.getMinLit(), x.getValLit()}));
				setDom(f, setMin, y.getMin(), Reason_new({b.getValLit(), y.getMinLit(), x.getValLit()}));
				setDom(y, setMax, f.getMax(), Reason_new({b.getValLit(), f.getMaxLit(), x.getValLit()}));
				setDom(f, setMax, y.getMax(), Reason_new({b.getValLit(), y.getMaxLit(), x.getValLit()}));
				if (y.isFixed() && f.isFixed()) {
					satisfied = true;
				}
			} else if (f.getMin() > y.getMax()) {
				Clause* r = Reason_new({x.getValLit(), f.getMinLit(), y.getMaxLit()});
				return b.setVal(false, r);
			} else if (f.getMax() < y.getMin()) {
				Clause* r = Reason_new({x.getValLit(), f.getMaxLit(), y.getMinLit()});
				return b.setVal(false, r);
			}
			return true;
		}

		if (b.isFixed()) {
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				if (y.getMax() < a[i].getMin()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMinLit(), y.getMaxLit()});
					setDom(x, remVal, i, r);
				}
				if (y.getMin() > a[i].getMax()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMaxLit(), y.getMinLit()});
					setDom(x, remVal, i, r);
				}
			}
		} else {
			std::vector<Lit> expl;
			bool push_min = false;
			bool push_max = false;
			unsigned int i = 0;
			while (i <= a.size()) {
				if (!x.indomain(i)) {
					expl.push_back(x.getLit(i, LR_EQ));
				} else if (y.getMax() < a[i].getMin()) {
					if (!push_max) {
						expl.push_back(y.getMaxLit());
						push_max = true;
					}
					expl.push_back(a[i].getMinLit());
				} else if (y.getMin() > a[i].getMax()) {
					if (!push_min) {
						expl.push_back(y.getMinLit());
						push_min = true;
					}
					expl.push_back(a[i].getMaxLit());
				} else {
					break;
				}
				i++;
			}
			if (i > x.getMax()) {
				Clause* r = Reason_new(expl);
				return b.setVal(false, r);
			}
		}

		if (no_min_support) {
			const int64_t old_m = y.getMin();
			int64_t new_m = INT64_MAX;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMin();
				if (cur_m < new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m <= old_m) {
						break;
					}
				}
			}
			min_support = best;
			if (y.setMinNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse lower bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMinLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMin(new_m, r)) {
						return false;
					}
				} else if (y.getMax() < new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMaxLit();
					return b.setVal(false, r);
				}
			}
			no_min_support = false;
		}

		if (no_max_support) {
			const int64_t old_m = y.getMax();
			int64_t new_m = INT_MIN;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMax();
				if (cur_m > new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m >= old_m) {
						break;
					}
				}
			}
			max_support = best;
			if (y.setMaxNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse upper bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMaxLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMax(new_m, r)) {
						return false;
					}
				} else if (y.getMin() > new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMinLit();
					return b.setVal(false, r);
				}
			}
			no_max_support = false;
		}

		return true;
	}